

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj,REF_INT *min_degree,REF_INT *min_degree_node)

{
  uint uVar1;
  int local_30;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT degree;
  REF_INT node;
  REF_INT *min_degree_node_local;
  REF_INT *min_degree_local;
  REF_ADJ ref_adj_local;
  
  *min_degree = -1;
  *min_degree_node = -1;
  ref_private_macro_code_rss = 0;
  _degree = min_degree_node;
  min_degree_node_local = min_degree;
  min_degree_local = &ref_adj->nnode;
  while( true ) {
    if (*min_degree_local <= ref_private_macro_code_rss) {
      return 0;
    }
    uVar1 = ref_adj_degree((REF_ADJ)min_degree_local,ref_private_macro_code_rss,&local_30);
    if (uVar1 != 0) break;
    if ((0 < local_30) && ((*_degree == -1 || (local_30 < *min_degree_node_local)))) {
      *_degree = ref_private_macro_code_rss;
      *min_degree_node_local = local_30;
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0xe4,
         "ref_adj_min_degree_node",(ulong)uVar1,"deg");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj, REF_INT *min_degree,
                                           REF_INT *min_degree_node) {
  REF_INT node, degree;
  *min_degree = REF_EMPTY;
  *min_degree_node = REF_EMPTY;

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    RSS(ref_adj_degree(ref_adj, node, &degree), "deg");
    if (degree > 0) {
      if (REF_EMPTY == (*min_degree_node) || degree < (*min_degree)) {
        *min_degree_node = node;
        *min_degree = degree;
      }
    }
  }

  return REF_SUCCESS;
}